

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsaa.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  double dVar2;
  GLfloat time;
  GLFWwindow *window;
  int samples;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window._0_4_ = 4;
  _samples = argv;
  argv_local._0_4_ = argc;
  while( true ) {
    window._4_4_ = getopt((int)argv_local,_samples,"hs:");
    if (window._4_4_ == -1) {
      glfwSetErrorCallback(error_callback);
      iVar1 = glfwInit();
      if (iVar1 == 0) {
        exit(1);
      }
      if ((uint)window == 0) {
        printf("Requesting that FSAA not be available\n");
      }
      else {
        printf("Requesting FSAA with %i samples\n",(ulong)(uint)window);
      }
      glfwWindowHint(0x2100d,(uint)window);
      handle = glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        glfwTerminate();
        exit(1);
      }
      glfwSetKeyCallback(handle,key_callback);
      glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
      glfwMakeContextCurrent(handle);
      glfwSwapInterval(1);
      iVar1 = glfwExtensionSupported("GL_ARB_multisample");
      if (iVar1 == 0) {
        glfwTerminate();
        exit(1);
      }
      glGetIntegerv(0x80a9,&window);
      if ((uint)window == 0) {
        printf("Context reports FSAA is unavailable\n");
      }
      else {
        printf("Context reports FSAA is available with %i samples\n",(ulong)(uint)window);
      }
      glMatrixMode(0x1701);
      gluOrtho2D(0,0x3ff0000000000000,0,0x3fe0000000000000);
      glMatrixMode(0x1700);
      while( true ) {
        iVar1 = glfwWindowShouldClose(handle);
        if (iVar1 != 0) break;
        dVar2 = glfwGetTime();
        glClear(0x4000);
        glLoadIdentity();
        glTranslatef(0x3e800000,0x3e800000,0);
        glRotatef((float)dVar2,0,0,0x3f800000);
        glDisable(0x809d);
        glRectf(0xbe19999a,0xbe19999a,0x3e19999a);
        glLoadIdentity();
        glTranslatef(0x3f400000,0x3e800000,0);
        glRotatef((float)dVar2,0,0,0x3f800000);
        glEnable(0x809d);
        glRectf(0xbe19999a);
        glfwSwapBuffers(handle);
        glfwPollEvents();
      }
      glfwTerminate();
      exit(0);
    }
    if (window._4_4_ == 0x68) {
      usage();
      exit(0);
    }
    if (window._4_4_ != 0x73) break;
    window._0_4_ = atoi(optarg);
  }
  usage();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting FSAA with %i samples\n", samples);
    else
        printf("Requesting that FSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    if (!glfwExtensionSupported("GL_ARB_multisample"))
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glGetIntegerv(GL_SAMPLES_ARB, &samples);
    if (samples)
        printf("Context reports FSAA is available with %i samples\n", samples);
    else
        printf("Context reports FSAA is unavailable\n");

    glMatrixMode(GL_PROJECTION);
    gluOrtho2D(0.f, 1.f, 0.f, 0.5f);
    glMatrixMode(GL_MODELVIEW);

    while (!glfwWindowShouldClose(window))
    {
        GLfloat time = (GLfloat) glfwGetTime();

        glClear(GL_COLOR_BUFFER_BIT);

        glLoadIdentity();
        glTranslatef(0.25f, 0.25f, 0.f);
        glRotatef(time, 0.f, 0.f, 1.f);

        glDisable(GL_MULTISAMPLE_ARB);
        glRectf(-0.15f, -0.15f, 0.15f, 0.15f);

        glLoadIdentity();
        glTranslatef(0.75f, 0.25f, 0.f);
        glRotatef(time, 0.f, 0.f, 1.f);

        glEnable(GL_MULTISAMPLE_ARB);
        glRectf(-0.15f, -0.15f, 0.15f, 0.15f);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}